

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool __thiscall QDir::makeAbsolute(QDir *this)

{
  bool bVar1;
  pointer pQVar2;
  QDirPrivate *in_RDI;
  long in_FS_OFFSET;
  QDirPrivate *d;
  QString absoluteFilePath;
  QString absolutePath;
  unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> dir;
  QDirPrivate *in_stack_ffffffffffffff48;
  unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *in_stack_ffffffffffffff50;
  QString *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff94;
  byte local_49;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QDir *)0x281150);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  std::unique_ptr<QDirPrivate,std::default_delete<QDirPrivate>>::
  unique_ptr<std::default_delete<QDirPrivate>,void>(in_stack_ffffffffffffff50);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x28117f);
  if (bVar1) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x2811b7);
    (*pQVar2->_vptr_QAbstractFileEngine[0x19])(&local_28,pQVar2,3);
    bVar1 = isRelativePath(in_stack_ffffffffffffff60);
    if (bVar1) {
      local_49 = 0;
    }
    else {
      uVar3 = bVar1;
      operator_new(0x118);
      QSharedDataPointer<QDirPrivate>::constData((QSharedDataPointer<QDirPrivate> *)0x28124d);
      QDirPrivate::QDirPrivate(in_RDI,(QDirPrivate *)CONCAT17(uVar3,in_stack_ffffffffffffff80));
      std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::reset
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::operator->
                ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)0x28127d);
      QDirPrivate::setPath
                ((QDirPrivate *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (QString *)in_RDI);
    }
    uVar4 = (uint)bVar1;
    QString::~QString((QString *)0x2812a4);
    if (uVar4 != 0) goto LAB_002813e7;
  }
  else {
    QDirPrivate::resolveAbsoluteEntry
              ((QDirPrivate *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    operator_new(0x118);
    QSharedDataPointer<QDirPrivate>::constData((QSharedDataPointer<QDirPrivate> *)0x281334);
    QDirPrivate::QDirPrivate
              (in_RDI,(QDirPrivate *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::reset
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::operator->
              ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)0x281364);
    QDirPrivate::setPath
              ((QDirPrivate *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (QString *)in_RDI);
    QString::~QString((QString *)0x28137d);
  }
  std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::release
            ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)0x2813cd);
  QSharedDataPointer<QDirPrivate>::operator=
            ((QSharedDataPointer<QDirPrivate> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
  ;
  local_49 = 1;
LAB_002813e7:
  std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::~unique_ptr
            (in_stack_ffffffffffffff50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_49 & 1);
}

Assistant:

bool QDir::makeAbsolute()
{
    Q_D(const QDir);
    std::unique_ptr<QDirPrivate> dir;
    if (!!d->fileEngine) {
        QString absolutePath = d->fileEngine->fileName(QAbstractFileEngine::AbsoluteName);
        if (QDir::isRelativePath(absolutePath))
            return false;

        dir.reset(new QDirPrivate(*d_ptr.constData()));
        dir->setPath(absolutePath);
    } else { // native FS
        QString absoluteFilePath = d->resolveAbsoluteEntry();
        dir.reset(new QDirPrivate(*d_ptr.constData()));
        dir->setPath(absoluteFilePath);
    }
    d_ptr = dir.release(); // actually detach
    return true;
}